

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::clear
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this)

{
  btAlignedObjectArray<btTriIndex> *in_RDI;
  
  btAlignedObjectArray<int>::clear((btAlignedObjectArray<int> *)in_RDI);
  btAlignedObjectArray<int>::clear((btAlignedObjectArray<int> *)in_RDI);
  btAlignedObjectArray<btTriIndex>::clear(in_RDI);
  btAlignedObjectArray<btHashKey<btTriIndex>_>::clear
            ((btAlignedObjectArray<btHashKey<btTriIndex>_> *)in_RDI);
  return;
}

Assistant:

void	clear()
	{
		m_hashTable.clear();
		m_next.clear();
		m_valueArray.clear();
		m_keyArray.clear();
	}